

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaOverlay.cpp
# Opt level: O3

void cursespp::SchemaOverlay::ShowIntOverlay
               (IntEntry *entry,PrefsPtr *prefs,
               function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *callback)

{
  int *__args;
  int maximum;
  Type TVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  double value;
  uint __val;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  InputOverlay *pIVar7;
  _func_void *p_Var8;
  OverlayStack *this_00;
  runtime_error *this_01;
  uint uVar9;
  ulong uVar10;
  char *pcVar11;
  uint __len;
  shared_ptr<cursespp::InputOverlay> dialog;
  shared_ptr<cursespp::NumberValidator<int>_> validator;
  anon_class_80_3_1ce9ae6c handler;
  string name;
  string title;
  allocator<char> local_1ca;
  allocator<char> local_1c9;
  string local_1c8;
  InputOverlay *local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a0;
  NumberValidator<int> *local_198;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_190;
  long *local_188 [2];
  long local_178 [2];
  ILayoutPtr local_168;
  shared_ptr<cursespp::InputOverlay::IValidator> local_158;
  long *local_148 [2];
  long local_138 [2];
  _Any_data local_128;
  code *local_118;
  code *pcStack_110;
  element_type *local_100;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  long *local_f0;
  long local_e8;
  long local_e0 [2];
  _Any_data local_d0;
  code *local_c0;
  string local_b0;
  long *local_90;
  long local_88;
  long local_80 [2];
  _Any_data local_70;
  code *local_60;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,(entry->entry).name,(allocator<char> *)&local_100);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_90,local_88 + (long)local_90);
  iVar6 = entry->minValue;
  maximum = entry->maxValue;
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>::
  function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
            *)&local_70,&intFormatter_abi_cxx11_);
  numberInputTitle<int>
            (&local_50,&local_b0,iVar6,maximum,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
              *)&local_70);
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  __args = &entry->minValue;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_198 = (NumberValidator<int> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cursespp::NumberValidator<int>,std::allocator<cursespp::NumberValidator<int>>,int_const&,int_const&,std::function<std::__cxx11::string(int)>&>
            (&local_190,&local_198,(allocator<cursespp::NumberValidator<int>_> *)&local_100,__args,
             &entry->maxValue,&intFormatter_abi_cxx11_);
  local_100 = (prefs->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
  local_f8 = (prefs->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_f8->_M_use_count = local_f8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_f8->_M_use_count = local_f8->_M_use_count + 1;
    }
  }
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_f0,local_90,local_88 + (long)local_90);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)&local_d0,callback);
  pIVar7 = (InputOverlay *)operator_new(0x308);
  InputOverlay::InputOverlay(pIVar7);
  std::__shared_ptr<cursespp::InputOverlay,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cursespp::InputOverlay,void>
            ((__shared_ptr<cursespp::InputOverlay,(__gnu_cxx::_Lock_policy)2> *)&local_1a8,pIVar7);
  pIVar7 = InputOverlay::SetTitle(local_1a8,&local_50);
  peVar2 = (prefs->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this = (prefs->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded == '\0') {
        LOCK();
        this->_M_use_count = this->_M_use_count + 1;
        UNLOCK();
        goto LAB_00173171;
      }
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
    this->_M_use_count = this->_M_use_count + 1;
  }
LAB_00173171:
  TVar1 = (entry->entry).type;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_148,(entry->entry).name,&local_1c9);
  switch(TVar1) {
  case Bool:
    bVar4 = (**(code **)(*(long *)peVar2 + 0x50))(peVar2,local_148,(char)*__args);
    pcVar11 = "false";
    if (bVar4 != 0) {
      pcVar11 = "true";
    }
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1c8,pcVar11,pcVar11 + ((ulong)bVar4 ^ 5));
    break;
  case Int:
    uVar5 = (**(code **)(*(long *)peVar2 + 0x58))(peVar2,local_148,entry->defaultValue);
    __val = -uVar5;
    if (0 < (int)uVar5) {
      __val = uVar5;
    }
    __len = 1;
    if (9 < __val) {
      uVar10 = (ulong)__val;
      uVar3 = 4;
      do {
        __len = uVar3;
        uVar9 = (uint)uVar10;
        if (uVar9 < 100) {
          __len = __len - 2;
          goto LAB_00173329;
        }
        if (uVar9 < 1000) {
          __len = __len - 1;
          goto LAB_00173329;
        }
        if (uVar9 < 10000) goto LAB_00173329;
        uVar10 = uVar10 / 10000;
        uVar3 = __len + 4;
      } while (99999 < uVar9);
      __len = __len + 1;
    }
LAB_00173329:
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_1c8,(char)-((int)uVar5 >> 0x1f) + (char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_1c8._M_dataplus._M_p + (uint)-((int)uVar5 >> 0x1f),__len,__val);
    break;
  case Double:
    TVar1 = entry[1].entry.type;
    value = (double)(**(code **)(*(long *)peVar2 + 0x60))((int)entry[1].entry.name,peVar2,local_148)
    ;
    stringValueForDouble_abi_cxx11_(&local_1c8,value,TVar1);
    break;
  case String:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_188,*(char **)__args,&local_1ca);
    (**(code **)(*(long *)peVar2 + 0x68))(&local_1c8,peVar2,local_148,local_188);
    goto LAB_00173287;
  case Enum:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_188,*(char **)&entry[1].entry,&local_1ca);
    (**(code **)(*(long *)peVar2 + 0x68))(&local_1c8,peVar2,local_148,local_188);
LAB_00173287:
    if (local_188[0] != local_178) {
      operator_delete(local_188[0],local_178[0] + 1);
    }
    break;
  default:
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"invalid type passed to stringValueFor!");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_148[0] != local_138) {
    operator_delete(local_148[0],local_138[0] + 1);
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  pIVar7 = InputOverlay::SetText(pIVar7,&local_1c8);
  local_158.super___shared_ptr<cursespp::InputOverlay::IValidator,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = &local_198->super_IValidator;
  local_158.super___shared_ptr<cursespp::InputOverlay::IValidator,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_190._M_pi;
  if (local_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_190._M_pi)->_M_use_count = (local_190._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_190._M_pi)->_M_use_count = (local_190._M_pi)->_M_use_count + 1;
    }
  }
  pIVar7 = InputOverlay::SetValidator(pIVar7,&local_158);
  iVar6 = Screen::GetWidth();
  pIVar7 = InputOverlay::SetWidth(pIVar7,(int)((float)iVar6 * 0.8));
  local_118 = (code *)0x0;
  pcStack_110 = (code *)0x0;
  local_128._M_unused._M_object = (void *)0x0;
  local_128._8_8_ = 0;
  p_Var8 = (_func_void *)operator_new(0x50);
  *(element_type **)p_Var8 = local_100;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var8 + 8) = local_f8;
  if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_f8->_M_use_count = local_f8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_f8->_M_use_count = local_f8->_M_use_count + 1;
    }
  }
  *(_func_void **)(p_Var8 + 0x10) = p_Var8 + 0x20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(p_Var8 + 0x10),local_f0,local_e8 + (long)local_f0);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)(p_Var8 + 0x30),
           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)&local_d0);
  pcStack_110 = std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:304:20)>
                ::_M_invoke;
  local_118 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:304:20)>
              ::_M_manager;
  local_128._M_unused._M_function_pointer = p_Var8;
  InputOverlay::SetInputAcceptedCallback(pIVar7,(InputAcceptedCallback *)&local_128);
  if (local_118 != (code *)0x0) {
    (*local_118)(&local_128,&local_128,__destroy_functor);
  }
  if (local_158.super___shared_ptr<cursespp::InputOverlay::IValidator,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.
               super___shared_ptr<cursespp::InputOverlay::IValidator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  this_00 = App::Overlays();
  local_168.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &(local_1a8->super_OverlayBase).super_LayoutBase.super_ILayout;
  if (local_1a8 == (InputOverlay *)0x0) {
    local_168.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  local_168.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_1a0;
  if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_1a0->_M_use_count = local_1a0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_1a0->_M_use_count = local_1a0->_M_use_count + 1;
    }
  }
  OverlayStack::Push(this_00,&local_168);
  if (local_168.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0);
  }
  if (local_c0 != (code *)0x0) {
    (*local_c0)(&local_d0,&local_d0,__destroy_functor);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
  }
  if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8);
  }
  if (local_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_190._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  return;
}

Assistant:

void SchemaOverlay::ShowIntOverlay(
    const ISchema::IntEntry* entry,
    PrefsPtr prefs,
    std::function<void(std::string)> callback)
{
    std::string name(entry->entry.name);

    auto title = numberInputTitle(
        name, entry->minValue, entry->maxValue, intFormatter);

    auto validator = std::make_shared<NumberValidator<int>>(
        entry->minValue,  entry->maxValue, intFormatter);

    auto handler = [prefs, name, callback](std::string value) {
        prefs->SetInt(name, (int) std::stod(value));
        if (callback) { callback(value); }
    };

    std::shared_ptr<InputOverlay> dialog(new InputOverlay());

    dialog->SetTitle(title)
        .SetText(stringValueFor(prefs, entry))
        .SetValidator(validator)
        .SetWidth(overlayWidth())
        .SetInputAcceptedCallback(handler);

    App::Overlays().Push(dialog);
}